

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<unsigned_char,char>(void)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  uchar ret;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> local_15;
  uchar local_14;
  char local_13;
  char local_12;
  char local_11;
  
  DivisionHelper<unsigned_char,_char,_1>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((uchar *)&local_15,&local_13,&local_14);
  operator/('\x01',(SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1
           );
  DivisionHelper<unsigned_char,_char,_1>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((uchar *)&local_15,&local_12,(uchar *)&local_15);
  DivisionHelper<unsigned_char,_char,_1>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((uchar *)&local_15,&local_11,(uchar *)&local_15);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            (&local_15,'\x01');
  SVar1 = SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                    (&local_15,
                     (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  operator<<(SVar1.m_int,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            (&local_15,'\x01');
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            (&local_15,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            (&local_15,'\x01');
  SVar1 = SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                    (&local_15,
                     (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  operator>>(SVar1.m_int,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            (&local_15,'\x01');
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            (&local_15,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}